

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanIdentifier
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,bool identifyKwds,EncodedCharPtr *pp)

{
  size_t multiUnits;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t multiUnitsBeforeLast;
  codepoint_t codePoint;
  bool fHasMultiChar;
  bool fHasEscape;
  EncodedCharPtr pchMin;
  EncodedCharPtr p;
  EncodedCharPtr *pp_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *pSStack_18;
  bool identifyKwds_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  _codePoint = *pp;
  multiUnitsBeforeLast._7_1_ = 0;
  multiUnitsBeforeLast._6_1_ = 0;
  multiUnitsBeforeLast._0_4_ = 0xffffffff;
  multiUnits = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  pchMin = _codePoint;
  p = (EncodedCharPtr)pp;
  pp_local._7_1_ = identifyKwds;
  pSStack_18 = this;
  bVar2 = TryReadCodePoint<true>
                    (this,&pchMin,this->m_pchLast,(codepoint_t *)&multiUnitsBeforeLast,
                     (bool *)((long)&multiUnitsBeforeLast + 7),
                     (bool *)((long)&multiUnitsBeforeLast + 6));
  if (bVar2) {
    if (0x10ffff < (uint)multiUnitsBeforeLast) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x1a5,"(codePoint < 0x110000u)","codePoint < 0x110000u");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = Js::CharClassifier::IsIdStart(this->charClassifier,(uint)multiUnitsBeforeLast);
    if (bVar2) {
      this_local._4_4_ =
           ScanIdentifierContinue
                     (this,(bool)(pp_local._7_1_ & 1),(bool)(multiUnitsBeforeLast._7_1_ & 1),
                      (bool)(multiUnitsBeforeLast._6_1_ & 1),_codePoint,pchMin,(EncodedCharPtr *)p);
    }
    else {
      UTF8EncodingPolicyBase<false>::RestoreMultiUnits
                (&this->super_UTF8EncodingPolicyBase<false>,multiUnits);
      this_local._4_4_ = tkLastKwd;
    }
  }
  else {
    this_local._4_4_ = tkLastKwd;
  }
  return this_local._4_4_;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanIdentifier(bool identifyKwds, EncodedCharPtr *pp)
{
    EncodedCharPtr p = *pp;
    EncodedCharPtr pchMin = p;

    // JS6 allows unicode characters in the form of \uxxxx escape sequences
    // to be part of the identifier.
    bool fHasEscape = false;
    bool fHasMultiChar = false;

    codepoint_t codePoint = INVALID_CODEPOINT;
    size_t multiUnitsBeforeLast = this->m_cMultiUnits;

    // Check if we started the id
    if (!TryReadCodePoint<true>(p, m_pchLast, &codePoint, &fHasEscape, &fHasMultiChar))
    {
        // If no chars. could be scanned as part of the identifier, return error.
        return tkScanError;
    }

    Assert(codePoint < 0x110000u);
    if (!charClassifier->IsIdStart(codePoint))
    {
        // Put back the last character
        this->RestoreMultiUnits(multiUnitsBeforeLast);

        // If no chars. could be scanned as part of the identifier, return error.
        return tkScanError;
    }

    return ScanIdentifierContinue(identifyKwds, fHasEscape, fHasMultiChar, pchMin, p, pp);
}